

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QPartialOrdering numericCompare(Private *d1,Private *d2)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMetaTypeInterface *iface1;
  double *pdVar4;
  Private *in_RSI;
  Private *in_RDI;
  long in_FS_OFFSET;
  uint promotedType;
  optional<double> r2;
  optional<double> r1;
  double in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QMetaTypeInterface *in_stack_ffffffffffffffa8;
  partial_ordering order;
  undefined4 in_stack_ffffffffffffffb8;
  uint promotedType_00;
  CompareUnderlyingType local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iface1 = QVariant::Private::typeInterface(in_RDI);
  promotedType_00 = (uint)in_RDI;
  QVariant::Private::typeInterface(in_RSI);
  iVar3 = numericTypePromotion(iface1,in_stack_ffffffffffffffa8);
  if (iVar3 == 6) {
    anon_unknown.dwarf_7eee46::qConvertToRealNumber
              ((Private *)CONCAT44(6,in_stack_ffffffffffffffb8));
    anon_unknown.dwarf_7eee46::qConvertToRealNumber
              ((Private *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
    bVar2 = std::optional::operator_cast_to_bool((optional<double> *)0x4385bb);
    if ((bVar2) &&
       (bVar2 = std::optional::operator_cast_to_bool((optional<double> *)0x4385cb), bVar2)) {
      pdVar4 = std::optional<double>::operator*((optional<double> *)0x4385e5);
      order.m_order = (CompareUnderlyingType)((ulong)*pdVar4 >> 0x38);
      std::optional<double>::operator*((optional<double> *)0x4385f9);
      Qt::compareThreeWay<double,_double,_true,_true>
                ((double)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      QPartialOrdering::QPartialOrdering
                ((QPartialOrdering *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 order);
    }
    else {
      local_29 = -0x7f;
    }
  }
  else {
    local_29 = (CompareUnderlyingType)
               integralCompare(promotedType_00,in_RSI,
                               (Private *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QPartialOrdering)local_29;
}

Assistant:

static QPartialOrdering numericCompare(const QVariant::Private *d1, const QVariant::Private *d2)
{
    uint promotedType = numericTypePromotion(d1->typeInterface(), d2->typeInterface());
    if (promotedType != QMetaType::QReal)
        return integralCompare(promotedType, d1, d2);

    // floating point comparison
    const auto r1 = qConvertToRealNumber(d1);
    const auto r2 = qConvertToRealNumber(d2);
    if (!r1 || !r2)
        return QPartialOrdering::Unordered;

    return Qt::compareThreeWay(*r1, *r2);
}